

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Image.cpp
# Opt level: O3

void __thiscall Image::drawOnto(Image *this,Image *image,Point point,Point sourcePoint,Size section)

{
  int iVar1;
  ulong uVar2;
  runtime_error *prVar3;
  long *plVar4;
  long *plVar5;
  long lVar6;
  uint uVar7;
  ulong uVar8;
  int iVar9;
  ulong uVar10;
  int iVar11;
  long lVar12;
  undefined1 *local_78 [2];
  undefined1 local_68 [16];
  long *local_58;
  long local_50;
  long local_48;
  long lStack_40;
  
  iVar9 = section.width;
  if (iVar9 + sourcePoint.x <= (this->size).width) {
    uVar2 = (ulong)sourcePoint >> 0x20;
    iVar1 = section.height;
    if (iVar1 + sourcePoint.y <= (this->size).height) {
      if ((iVar9 + point.x <= (image->size).width) &&
         (uVar10 = (ulong)point >> 0x20, iVar1 + point.y <= (image->size).height)) {
        if (0 < iVar1) {
          iVar11 = 0;
          do {
            uVar8 = (ulong)section & 0xffffffff;
            lVar6 = (long)sourcePoint.x;
            lVar12 = (long)point.x;
            if (0 < iVar9) {
              do {
                (image->colorData).super__Vector_base<Color,_std::allocator<Color>_>._M_impl.
                super__Vector_impl_data._M_start
                [(long)(int)uVar10 * (long)(image->size).width + lVar12] =
                     (this->colorData).super__Vector_base<Color,_std::allocator<Color>_>._M_impl.
                     super__Vector_impl_data._M_start
                     [(long)(int)uVar2 * (long)(this->size).width + lVar6];
                lVar12 = lVar12 + 1;
                lVar6 = lVar6 + 1;
                uVar7 = (int)uVar8 - 1;
                uVar8 = (ulong)uVar7;
              } while (uVar7 != 0);
            }
            iVar11 = iVar11 + 1;
            uVar10 = (ulong)((int)uVar10 + 1);
            uVar2 = (ulong)((int)uVar2 + 1);
          } while (iVar11 != iVar1);
        }
        return;
      }
      prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
      local_78[0] = local_68;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_78,"Failed assertion ","");
      plVar4 = (long *)std::__cxx11::string::append((char *)local_78);
      local_58 = (long *)*plVar4;
      plVar5 = plVar4 + 2;
      if (local_58 == plVar5) {
        local_48 = *plVar5;
        lStack_40 = plVar4[3];
        local_58 = &local_48;
      }
      else {
        local_48 = *plVar5;
      }
      local_50 = plVar4[1];
      *plVar4 = (long)plVar5;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      std::runtime_error::runtime_error(prVar3,(string *)&local_58);
      __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
  local_78[0] = local_68;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_78,"Failed assertion ","");
  plVar4 = (long *)std::__cxx11::string::append((char *)local_78);
  local_58 = (long *)*plVar4;
  plVar5 = plVar4 + 2;
  if (local_58 == plVar5) {
    local_48 = *plVar5;
    lStack_40 = plVar4[3];
    local_58 = &local_48;
  }
  else {
    local_48 = *plVar5;
  }
  local_50 = plVar4[1];
  *plVar4 = (long)plVar5;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  std::runtime_error::runtime_error(prVar3,(string *)&local_58);
  __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void Image::drawOnto(Image &image, Point point, Point sourcePoint, Size section) const {
	throwing_assert(sourcePoint.x + section.width <= size.width && sourcePoint.y + section.height <= size.height);
	throwing_assert(point.x + section.width <= image.size.width && point.y + section.height <= image.size.height);

	for (int y = 0; y < section.height; y++) {
		for (int x = 0; x < section.width; x++) {
			image.pixel(x + point.x, y + point.y) = this->pixel(x + sourcePoint.x, y + sourcePoint.y);
		}
	}
}